

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

bool __thiscall re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  ushort uVar1;
  const_pointer pcVar2;
  uint *puVar3;
  Job *pJVar4;
  Inst *pIVar5;
  StringPiece *pSVar6;
  char **ppcVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  uint32_t uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  byte *pbVar22;
  uint uVar23;
  byte *p;
  long lVar24;
  byte unaff_R15B;
  bool bVar25;
  LogMessage local_1b0;
  
  pcVar2 = (this->text_).data_;
  pbVar22 = (byte *)(pcVar2 + (this->text_).size_);
  this->njob_ = 0;
  iVar21 = ((int)(this->text_).size_ + 1) *
           (uint)((_Head_base<0UL,_unsigned_short_*,_false> *)
                 ((long)&(this->prog_->list_heads_).ptr_._M_t.
                         super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>
                 + 8))->_M_head_impl[id0];
  iVar13 = (int)p0 - (int)pcVar2;
  uVar16 = iVar21 + iVar13;
  uVar23 = iVar21 + iVar13 + 0x1f;
  if (-1 < (int)uVar16) {
    uVar23 = uVar16;
  }
  puVar3 = (this->visited_).ptr_._M_t.
           super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  uVar20 = puVar3[(int)uVar23 >> 5];
  if ((uVar20 >> (uVar16 & 0x1f) & 1) == 0) {
    puVar3[(int)uVar23 >> 5] = 1 << ((byte)uVar16 & 0x1f) | uVar20;
    Push(this,id0,p0);
  }
  iVar13 = this->njob_;
  if (iVar13 < 1) {
    bVar12 = 0;
  }
  else {
    bVar11 = 0;
    do {
      this->njob_ = iVar13 + -1;
      pJVar4 = (this->job_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
               super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl;
      uVar23 = pJVar4[(long)iVar13 + -1].id;
      p = (byte *)pJVar4[(long)iVar13 + -1].p;
      if ((int)uVar23 < 0) {
        (this->cap_).ptr_._M_t.
        super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
        super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
        super__Head_base<0UL,_const_char_**,_false>._M_head_impl
        [((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
         ((long)&(this->prog_->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
         + 8))->_M_head_impl[-uVar23].field_1.cap_] = (char *)p;
        lVar24 = 0;
      }
      else {
        iVar21 = pJVar4[(long)iVar13 + -1].rle;
        if (0 < (long)iVar21) {
          p = p + iVar21;
          pJVar4[(long)iVar13 + -1].rle = iVar21 + -1;
          this->njob_ = this->njob_ + 1;
        }
        do {
          pIVar5 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                   ((long)&(this->prog_->inst_).ptr_._M_t.
                           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                   + 8))->_M_head_impl;
          uVar16 = pIVar5[(int)uVar23].out_opcode_;
          lVar24 = 0;
          uVar20 = uVar23;
          bVar12 = unaff_R15B;
          switch(uVar16 & 7) {
          case 0:
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/bitstate.cc"
                       ,0xa8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1b0.str_,"Unexpected opcode: ",0x13);
            std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar5[(int)uVar23].out_opcode_ & 7)
            ;
            LogMessage::~LogMessage(&local_1b0);
            lVar24 = 1;
            bVar25 = false;
            bVar12 = 0;
            break;
          case 1:
            uVar19 = pIVar5[uVar16 >> 4].out_opcode_ & 7;
            if ((uVar19 == 2) ||
               ((uVar19 == 6 &&
                ((pIVar5[pIVar5[uVar16 >> 4].out_opcode_ >> 4].out_opcode_ & 7) == 2)))) {
              lVar24 = 4;
              bVar25 = true;
              p = pbVar22;
              uVar23 = pIVar5[(int)uVar23].field_1.cap_;
            }
            else {
              if (this->longest_ == false) goto LAB_001b0bf9;
              lVar24 = 4;
              bVar25 = true;
              p = pbVar22;
              uVar23 = uVar16 >> 4;
            }
            break;
          case 2:
            uVar16 = 0xffffffff;
            if (p < pbVar22) {
              uVar16 = (uint)*p;
            }
            uVar1 = pIVar5[(int)uVar23].field_1.field_3.hint_foldcase_;
            uVar19 = uVar16 | 0x20;
            if ((uVar1 & 1) == 0) {
              uVar19 = uVar16;
            }
            if (0x19 < uVar16 - 0x41) {
              uVar19 = uVar16;
            }
            bVar25 = (int)uVar19 < (int)(uint)pIVar5[(int)uVar23].field_1.field_3.lo_;
            bVar10 = (int)(uint)pIVar5[(int)uVar23].field_1.field_3.hi_ < (int)uVar19;
            if (!bVar10 && !bVar25) {
              if (1 < uVar1) {
                Push(this,uVar23 + (uVar1 >> 1),(char *)p);
              }
              uVar20 = pIVar5[(int)uVar23].out_opcode_ >> 4;
              p = p + 1;
            }
            if (bVar10 || bVar25) {
LAB_001b0bf9:
              bVar25 = false;
              if ((pIVar5[(int)uVar23].out_opcode_ & 8) == 0) {
                lVar24 = 4;
                bVar25 = true;
                uVar23 = uVar20 + 1;
                bVar12 = unaff_R15B;
              }
              else {
                lVar24 = 0;
                uVar23 = uVar20;
                bVar12 = unaff_R15B;
              }
              break;
            }
            goto LAB_001b0b48;
          case 3:
            if ((uVar16 & 8) == 0) {
              Push(this,uVar23 + 1,(char *)p);
            }
            iVar13 = pIVar5[(int)uVar23].field_1.cap_;
            if ((-1 < (long)iVar13) &&
               (iVar13 < (int)(this->cap_).ptr_._M_t.
                              super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>
                              .super__Tuple_impl<1UL,_re2::PODArray<const_char_*>::Deleter>.
                              super__Head_base<1UL,_re2::PODArray<const_char_*>::Deleter,_false>)) {
              Push(this,-uVar23,
                   (this->cap_).ptr_._M_t.
                   super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
                   super__Head_base<0UL,_const_char_**,_false>._M_head_impl[iVar13]);
              (this->cap_).ptr_._M_t.
              super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
              super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
              super__Head_base<0UL,_const_char_**,_false>._M_head_impl
              [pIVar5[(int)uVar23].field_1.cap_] = (char *)p;
            }
            goto LAB_001b0b3e;
          case 4:
            uVar16 = pIVar5[(int)uVar23].field_1.out1_;
            uVar14 = Prog::EmptyFlags(&this->context_,(char *)p);
            if ((uVar16 & ~uVar14) != 0) goto LAB_001b0bf9;
            if ((pIVar5[(int)uVar23].out_opcode_ & 8) == 0) {
              Push(this,uVar23 + 1,(char *)p);
            }
            goto LAB_001b0b3e;
          case 5:
            if ((this->endmatch_ == true) && (p != pbVar22)) goto LAB_001b0bf9;
            uVar16 = this->nsubmatch_;
            uVar15 = (ulong)uVar16;
            lVar24 = 1;
            if (uVar16 == 0) {
              bVar25 = false;
              bVar12 = 1;
            }
            else {
              (this->cap_).ptr_._M_t.
              super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
              super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
              super__Head_base<0UL,_const_char_**,_false>._M_head_impl[1] = (char *)p;
              pcVar2 = this->submatch_->data_;
              if (pcVar2 == (const_pointer)0x0) {
                if (0 < (int)uVar16) goto LAB_001b0ba6;
              }
              else if ((this->longest_ == true) &&
                      (pcVar2 + this->submatch_->size_ < p && 0 < (int)uVar16)) {
LAB_001b0ba6:
                if ((int)uVar16 < 2) {
                  uVar15 = 1;
                }
                lVar17 = 0;
                do {
                  pSVar6 = this->submatch_;
                  ppcVar7 = (this->cap_).ptr_._M_t.
                            super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>
                            .super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
                  lVar8 = *(long *)((long)ppcVar7 + lVar17);
                  lVar9 = *(long *)((long)ppcVar7 + lVar17 + 8);
                  *(long *)((long)&pSVar6->data_ + lVar17) = lVar8;
                  *(long *)((long)&pSVar6->size_ + lVar17) = lVar9 - lVar8;
                  lVar17 = lVar17 + 0x10;
                } while (uVar15 * 0x10 != lVar17);
              }
              bVar11 = 1;
              bVar25 = false;
              if (this->longest_ == true) {
                bVar25 = false;
                bVar12 = 1;
                if (p != pbVar22) goto LAB_001b0bf9;
              }
              else {
                bVar12 = 1;
              }
            }
            break;
          case 6:
            if ((uVar16 & 8) == 0) {
              Push(this,uVar23 + 1,(char *)p);
            }
LAB_001b0b3e:
            uVar20 = pIVar5[(int)uVar23].out_opcode_ >> 4;
LAB_001b0b48:
            lVar24 = 0;
            iVar13 = ((int)(this->text_).size_ + 1) *
                     (uint)((_Head_base<0UL,_unsigned_short_*,_false> *)
                           ((long)&(this->prog_->list_heads_).ptr_._M_t.
                                   super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>
                           + 8))->_M_head_impl[(int)uVar20];
            iVar18 = (int)p - *(int *)&(this->text_).data_;
            iVar21 = iVar13 + iVar18;
            iVar13 = iVar13 + iVar18 + 0x1f;
            if (-1 < iVar21) {
              iVar13 = iVar21;
            }
            uVar19 = 1 << ((byte)iVar21 & 0x1f);
            puVar3 = (this->visited_).ptr_._M_t.
                     super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
                     super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
            uVar16 = puVar3[iVar13 >> 5];
            bVar25 = (uVar19 & uVar16) == 0;
            uVar23 = uVar20;
            if (bVar25) {
              puVar3[iVar13 >> 5] = uVar19 | uVar16;
              lVar24 = 4;
            }
            break;
          case 7:
            bVar25 = false;
          }
          unaff_R15B = bVar12;
        } while (bVar25);
      }
      bVar12 = unaff_R15B;
    } while ((lVar24 == 0) && (iVar13 = this->njob_, bVar12 = bVar11, 0 < iVar13));
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  const char* end = text_.data() + text_.size();
  njob_ = 0;
  // Push() no longer checks ShouldVisit(),
  // so we must perform the check ourselves.
  if (ShouldVisit(id0, p0))
    Push(id0, p0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    int& rle = job_[njob_].rle;
    const char* p = job_[njob_].p;

    if (id < 0) {
      // Undo the Capture.
      cap_[prog_->inst(-id)->cap()] = p;
      continue;
    }

    if (rle > 0) {
      p += rle;
      // Revivify job on stack.
      --rle;
      ++njob_;
    }

  Loop:
    // Visit id, p.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode();
        return false;

      case kInstFail:
        break;

      case kInstAltMatch:
        if (ip->greedy(prog_)) {
          // out1 is the Match instruction.
          id = ip->out1();
          p = end;
          goto Loop;
        }
        if (longest_) {
          // ip must be non-greedy...
          // out is the Match instruction.
          id = ip->out();
          p = end;
          goto Loop;
        }
        goto Next;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (ip->hint() != 0)
          Push(id+ip->hint(), p);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done

        if (0 <= ip->cap() && ip->cap() < cap_.size()) {
          // Capture p to register, but save old value first.
          Push(-id, cap_[ip->cap()]);  // undo when we're done
          cap_[ip->cap()] = p;
        }

        id = ip->out();
        goto CheckAndLoop;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();

      CheckAndLoop:
        // Sanity check: id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        DCHECK(id == 0 || prog_->inst(id-1)->last());
        if (ShouldVisit(id, p))
          goto Loop;
        break;

      case kInstMatch: {
        if (endmatch_ && p != end)
          goto Next;

        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].data() + submatch_[0].size())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i] =
                StringPiece(cap_[2 * i],
                            static_cast<size_t>(cap_[2 * i + 1] - cap_[2 * i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == end)
          return true;

        // Otherwise, continue on in hope of a longer match.
        // Note the absence of the ShouldVisit() check here
        // due to execution remaining in the same list.
      Next:
        if (!ip->last()) {
          id++;
          goto Loop;
        }
        break;
      }
    }
  }
  return matched;
}